

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

bool P_CheckMove(AActor *thing,DVector2 *pos,int flags)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  double dVar4;
  bool bVar5;
  uint uVar6;
  double local_d0;
  FCheckPosition local_c0;
  
  local_c0.LastRipped.NumUsed = 0;
  TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>::SetNodeVector
            (&local_c0.LastRipped,1);
  local_c0.DoRipping = false;
  local_c0.PushTime = 0;
  local_c0.FromPMove = false;
  dVar1 = (thing->__Pos).Z;
  bVar5 = P_CheckPosition(thing,pos,&local_c0,false);
  dVar4 = local_c0.floorz;
  if ((bVar5) ||
     ((((flags != 0 && ((flags & 6U) != 0)) &&
       (((flags & 2U) != 0 || (thing->BlockingMobj == (AActor *)0x0)))) &&
      (((flags & 4U) != 0 || (thing->BlockingLine == (line_t *)0x0)))))) {
    uVar2 = (thing->flags3).Value;
    local_d0 = local_c0.floorz;
    if (((uVar2 & 1) == 0) && (local_d0 = dVar1, (uVar2 & 2) != 0)) {
      local_d0 = local_c0.ceilingz - thing->Height;
    }
    uVar3 = (thing->flags).Value;
    if ((uVar3 >> 0xc & 1) != 0) {
LAB_0040efd7:
      bVar5 = true;
      goto LAB_0040efda;
    }
    dVar1 = thing->Height;
    if (dVar1 <= local_c0.ceilingz - local_c0.floorz) {
      uVar6 = (thing->flags2).Value;
      if ((((uVar2 & 2) != 0) || ((uVar3 & 0x8000) != 0)) || (dVar1 <= local_c0.ceilingz - local_d0)
         ) {
        if ((uVar3 >> 9 & 1) != 0 && (uVar6 & 0x10) != 0) goto LAB_0040ef9c;
LAB_0040efa7:
        if ((uVar2 & 1) != 0 || (uVar3 & 0x8000) != 0) goto LAB_0040efab;
        if ((local_c0.floorz - local_d0 < thing->MaxStepHeight ||
             local_c0.floorz - local_d0 == thing->MaxStepHeight) &&
           ((((uVar3 >> 0x10 & 1) == 0 || (((thing->flags6).Value & 0x80) != 0)) ||
            (local_c0.floorz <= local_d0)))) {
          if (local_c0.floorz <= local_d0) {
            if (((uVar3 & 0x4400) != 0 || (flags & 1U) == 0) ||
               (local_d0 - local_c0.dropoffz < thing->MaxDropOffHeight ||
                local_d0 - local_c0.dropoffz == thing->MaxDropOffHeight)) goto LAB_0040efab;
          }
          else {
            dVar1 = (thing->__Pos).Z;
            (thing->__Pos).Z = local_c0.floorz;
            bVar5 = P_TestMobjZ(thing,true,(AActor **)0x0);
            (thing->__Pos).Z = dVar1;
            if (bVar5) {
              uVar6 = (thing->flags2).Value;
              local_d0 = dVar4;
LAB_0040efab:
              if ((uVar6 >> 0x19 & 1) != 0) {
                bVar5 = false;
                if (((local_c0.floorpic.texnum != (thing->floorpic).texnum) ||
                    (bVar5 = false, local_c0.floorz - local_d0 != 0.0)) ||
                   (NAN(local_c0.floorz - local_d0))) goto LAB_0040efda;
              }
              goto LAB_0040efd7;
            }
          }
        }
      }
      else if ((uVar3 >> 9 & 1) != 0 && (uVar6 & 0x10) != 0) {
LAB_0040ef9c:
        if (dVar1 + (thing->__Pos).Z <= local_c0.ceilingz) goto LAB_0040efa7;
      }
    }
  }
  bVar5 = false;
LAB_0040efda:
  M_Free(local_c0.LastRipped.Nodes);
  return bVar5;
}

Assistant:

bool P_CheckMove(AActor *thing, const DVector2 &pos, int flags)
{
	FCheckPosition tm;
	double		newz = thing->Z();

	if (!P_CheckPosition(thing, pos, tm))
	{
		// Ignore PCM_DROPOFF. Not necessary here: a little later it is.
		if (!flags || (!(flags & PCM_NOACTORS) && !(flags & PCM_NOLINES)))
		{
			return false;
		}
		if (!(flags & PCM_NOACTORS) && thing->BlockingMobj)
		{
			return false;
		}
		if (!(flags & PCM_NOLINES) && thing->BlockingLine)
		{
			return false;
		}
	}

	if (thing->flags3 & MF3_FLOORHUGGER)
	{
		newz = tm.floorz;
	}
	else if (thing->flags3 & MF3_CEILINGHUGGER)
	{
		newz = tm.ceilingz - thing->Height;
	}

	if (!(thing->flags & MF_NOCLIP))
	{
		if (tm.ceilingz - tm.floorz < thing->Height)
		{
			return false;
		}

		if (!(thing->flags & MF_TELEPORT)
			&& tm.ceilingz - newz < thing->Height
			&& !(thing->flags3 & MF3_CEILINGHUGGER)
			&& (!(thing->flags2 & MF2_FLY) || !(thing->flags & MF_NOGRAVITY)))
		{
			return false;
		}
		if (thing->flags2 & MF2_FLY && thing->flags & MF_NOGRAVITY)
		{
			if (thing->Top() > tm.ceilingz)
				return false;
		}
		if (!(thing->flags & MF_TELEPORT) && !(thing->flags3 & MF3_FLOORHUGGER))
		{
			if (tm.floorz - newz > thing->MaxStepHeight)
			{ // too big a step up
				return false;
			}
			else if ((thing->flags & MF_MISSILE) && !(thing->flags6 & MF6_STEPMISSILE) && tm.floorz > newz)
			{ // [RH] Don't let normal missiles climb steps
				return false;
			}
			else if (newz < tm.floorz)
			{ // [RH] Check to make sure there's nothing in the way for the step up
				double savedz = thing->Z();
				thing->SetZ(newz = tm.floorz);
				bool good = P_TestMobjZ(thing);
				thing->SetZ(savedz);
				if (!good)
				{
					return false;
				}
			}
			else if ((flags & PCM_DROPOFF) && !(thing->flags & (MF_FLOAT|MF_DROPOFF)))
			{
				if (newz - tm.dropoffz > thing->MaxDropOffHeight)
				{
					return false;
				}
			}
		}

		if (thing->flags2 & MF2_CANTLEAVEFLOORPIC
			&& (tm.floorpic != thing->floorpic
			|| tm.floorz - newz != 0))
		{ // must stay within a sector of a certain floor type
			return false;
		}
	}

	return true;
}